

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O2

int __thiscall
CTextRender::LoadFontCollection(CTextRender *this,void *pFilename,void *pBuf,long FileSize)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  FT_Face_conflict FtFace;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = FT_New_Memory_Face(this->m_FTLibrary,pBuf,FileSize,0xffffffffffffffff,&FtFace);
  if (iVar2 == 0) {
    uVar1 = (uint)FtFace->num_faces;
    FT_Done_Face();
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      iVar2 = FT_New_Memory_Face(this->m_FTLibrary,pBuf,FileSize,uVar3,&FtFace);
      if (iVar2 != 0) {
LAB_00128229:
        FT_Done_Face(FtFace);
        uVar4 = uVar3 & 0xffffffff;
        break;
      }
      iVar2 = CGlyphMap::AddFace(this->m_pGlyphMap,FtFace);
      if (iVar2 != 0) goto LAB_00128229;
    }
    iVar2 = 0;
    dbg_msg("textrender","loaded %d faces from font file \'%s\'",uVar4,pFilename);
  }
  else {
    iVar2 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CTextRender::LoadFontCollection(const void *pFilename, const void *pBuf, long FileSize)
{
	FT_Face FtFace;

	if(FT_New_Memory_Face(m_FTLibrary, (FT_Byte *)pBuf, FileSize, -1, &FtFace))
		return -1;

	int NumFaces = FtFace->num_faces;
	FT_Done_Face(FtFace);

	int i;
	for(i = 0; i < NumFaces; ++i)
	{
		if(FT_New_Memory_Face(m_FTLibrary, (FT_Byte *)pBuf, FileSize, i, &FtFace))
		{
			FT_Done_Face(FtFace);
			break;
		}

		if(m_pGlyphMap->AddFace(FtFace))
		{
			FT_Done_Face(FtFace);
			break;
		}
	}

	dbg_msg("textrender", "loaded %d faces from font file '%s'", i, (char *)pFilename);

	return 0;
}